

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::advance_setup(PeleLM *this,Real time,Real dt,int iteration,int ncycle)

{
  bool bVar1;
  int srccomp;
  MFIter *this_00;
  NavierStokesBase *this_01;
  MultiFab *pMVar2;
  key_type *in_RDI;
  int in_stack_00000038;
  int in_stack_0000003c;
  Real in_stack_00000040;
  Real in_stack_00000048;
  NavierStokesBase *in_stack_00000050;
  int i;
  MultiFab *ostate;
  MultiFab *nstate;
  int k;
  Array4<double> *rhoY;
  Box *bx;
  MFIter mfi;
  MultiFab *S_old;
  PeleLM *in_stack_000005a0;
  mapped_type *in_stack_fffffffffffffe28;
  PeleLM *in_stack_fffffffffffffe30;
  MFIter *in_stack_fffffffffffffe38;
  allocator *paVar3;
  NavierStokesBase *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffffe58;
  MFIter *in_stack_fffffffffffffe60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
  *in_stack_fffffffffffffe70;
  anon_class_64_1_8991137e *in_stack_fffffffffffffe78;
  Box *in_stack_fffffffffffffe80;
  string local_178 [8];
  MFIter *in_stack_fffffffffffffe90;
  int local_154;
  int local_13c;
  undefined1 local_138 [64];
  undefined1 local_f8 [64];
  undefined1 *local_b8;
  undefined1 local_ac [132];
  MFIter *local_28;
  
  do_tiling_ = (undefined1)((uint)in_stack_fffffffffffffe54 >> 0x18);
  NavierStokesBase::advance_setup
            (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003c,
             in_stack_00000038);
  this_00 = (MFIter *)
            amrex::AmrLevel::get_old_data
                      ((AmrLevel *)in_stack_fffffffffffffe30,
                       (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
  local_28 = this_00;
  if (floor_species == 1) {
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter(this_00,in_stack_fffffffffffffe58,(bool)do_tiling_);
    in_stack_fffffffffffffe60 = this_00;
    while (bVar1 = amrex::MFIter::isValid((MFIter *)(local_ac + 0x24)), bVar1) {
      amrex::MFIter::tilebox(in_stack_fffffffffffffe90);
      local_ac._28_8_ = local_ac;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
      local_b8 = local_f8;
      in_stack_fffffffffffffe58 = (FabArrayBase *)local_ac._28_8_;
      memcpy(local_138,local_b8,0x3c);
      amrex::ParallelFor<PeleLM::advance_setup(double,double,int,int)::__0>
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      amrex::MFIter::operator++((MFIter *)(local_ac + 0x24));
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffffe30);
  }
  RhoH_to_Temp((MultiFab *)mfi.tile_size.vect._0_8_,mfi.fabArray._4_4_,(int)mfi.fabArray);
  for (local_13c = 0; local_13c < NavierStokesBase::num_state_type; local_13c = local_13c + 1) {
    this_01 = (NavierStokesBase *)
              amrex::AmrLevel::get_new_data
                        ((AmrLevel *)in_stack_fffffffffffffe30,
                         (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
    pMVar2 = amrex::AmrLevel::get_old_data
                       ((AmrLevel *)in_stack_fffffffffffffe30,
                        (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
    in_stack_fffffffffffffe40 = this_01;
    srccomp = amrex::FabArrayBase::nComp((FabArrayBase *)this_01);
    amrex::FabArrayBase::nGrow((FabArrayBase *)this_01,0);
    amrex::MultiFab::Copy
              ((MultiFab *)in_stack_fffffffffffffe60,(MultiFab *)in_stack_fffffffffffffe58,srccomp,
               in_stack_fffffffffffffe50,(int)((ulong)pMVar2 >> 0x20),(int)pMVar2);
  }
  if ((int)in_RDI->_M_string_length == 0) {
    set_htt_hmixTYP(in_stack_000005a0);
  }
  NavierStokesBase::make_rho_curr_time(in_stack_fffffffffffffe40);
  if (((plot_reactions & 1U) != 0) && ((int)in_RDI->_M_string_length == 0)) {
    for (local_154 = amrex::AmrMesh::finestLevel
                               ((AmrMesh *)in_RDI[10].field_2._M_allocated_capacity); -1 < local_154
        ; local_154 = local_154 + -1) {
      in_stack_fffffffffffffe30 =
           getLevel(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      in_stack_fffffffffffffe30 = (PeleLM *)&in_stack_fffffffffffffe30->auxDiag;
      paVar3 = (allocator *)&stack0xfffffffffffffe87;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"REACTIONS",paVar3);
      in_stack_fffffffffffffe28 =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
           ::operator[](in_stack_fffffffffffffe70,in_RDI);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x50fa65);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffe30,
                 (value_type)in_stack_fffffffffffffe28);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe87);
    }
  }
  return;
}

Assistant:

void
PeleLM::advance_setup (Real time,
                       Real dt,
                       int  iteration,
                       int  ncycle)
{
   NavierStokesBase::advance_setup(time, dt, iteration, ncycle);

   // Perform operations on old data before copying into New:
   // Floor species if required.
   MultiFab& S_old = get_old_data(State_Type);
   if (floor_species == 1)
   {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
      for (MFIter mfi(S_old,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx     = mfi.tilebox();
         auto const& rhoY  = S_old.array(mfi,first_spec);
         amrex::ParallelFor(bx, [rhoY]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            fabMinMax( i, j, k, NUM_SPECIES, 0.0, Real_MAX, rhoY);
         });
      }
   }

   // Reset temperature
   RhoH_to_Temp(S_old);

   // Copy States Old -> New
   for (int k = 0; k < num_state_type; k++)
   {
      MultiFab& nstate = get_new_data(k);
      const MultiFab& ostate = get_old_data(k);
      MultiFab::Copy(nstate,ostate,0,0,nstate.nComp(),nstate.nGrow());
   }
   if (level == 0) {
      set_htt_hmixTYP();
   }

   // Make rho_new in NSB, rho_old already done in NSB::advance_setup
   make_rho_curr_time();

   if (plot_reactions && level == 0)
   {
      for (int i = parent->finestLevel(); i >= 0; --i)
         getLevel(i).auxDiag["REACTIONS"]->setVal(0);
   }
}